

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::CreatePBufferSurface::exec(CreatePBufferSurface *this,Thread *t)

{
  _func_int **pp_Var1;
  deUint32 err;
  MessageBuilder *pMVar2;
  EGLSurface pvVar3;
  Surface *pSVar4;
  MessageBuilder local_368;
  MessageBuilder local_1c8;
  undefined4 local_38;
  EGLint local_34;
  EGLint attriblist [5];
  EGLThread *thread;
  Thread *t_local;
  CreatePBufferSurface *this_local;
  
  register0x00000000 =
       (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (register0x00000000 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  local_38 = 0x3057;
  local_34 = this->m_width;
  attriblist[0] = 0x3056;
  attriblist[1] = this->m_height;
  attriblist[2] = 0x3038;
  tcu::ThreadUtil::Thread::newMessage(&local_1c8,register0x00000000);
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1c8,(char (*) [34])"Begin -- eglCreatePbufferSurface(");
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,&this->m_display);
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a4b1eb);
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,&this->m_config);
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,(char (*) [16])", { EGL_WIDTH, ");
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,&this->m_width);
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,(char (*) [15])", EGL_HEIGHT, ");
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,&this->m_height);
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,(char (*) [14])0x2b4c661);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1c8);
  pp_Var1 = stack0xffffffffffffffe0[1].super_Thread._vptr_Thread;
  pvVar3 = (EGLSurface)
           (**(code **)(*pp_Var1 + 0x50))(pp_Var1,this->m_display,this->m_config,&local_38);
  pSVar4 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::operator->(&this->m_surface);
  pSVar4->surface = pvVar3;
  tcu::ThreadUtil::Thread::newMessage(&local_368,stack0xffffffffffffffe0);
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<(&local_368,(char (*) [8])"End -- ");
  pSVar4 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::operator->(&this->m_surface);
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,&pSVar4->surface);
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (pMVar2,(char (*) [28])"= eglCreatePbufferSurface()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_368);
  err = (**(code **)(*stack0xffffffffffffffe0[1].super_Thread._vptr_Thread + 0xf8))();
  eglu::checkError(err,"eglCreatePbufferSurface()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                   ,0x33d);
  return;
}

Assistant:

void CreatePBufferSurface::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	const EGLint attriblist[] = {
		EGL_WIDTH, m_width,
		EGL_HEIGHT, m_height,
		EGL_NONE
	};

	thread.newMessage() << "Begin -- eglCreatePbufferSurface(" << m_display << ", " << m_config << ", { EGL_WIDTH, " << m_width << ", EGL_HEIGHT, " << m_height << ", EGL_NONE })" << tcu::ThreadUtil::Message::End;
	m_surface->surface = thread.egl.createPbufferSurface(m_display, m_config, attriblist);
	thread.newMessage() << "End -- " << m_surface->surface << "= eglCreatePbufferSurface()" << tcu::ThreadUtil::Message::End;
	EGLU_CHECK_MSG(thread.egl, "eglCreatePbufferSurface()");
}